

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_compliance_ut.c
# Opt level: O2

int pal_fan_set_speed_low_success(void)

{
  pal_result pVar1;
  
  puts("Execute test pal_fan_set_speed_low_success\r");
  pVar1 = pal_fan_set_speed(-800);
  if (pVar1 == PAL_OK) {
    puts("Succeeded\r\n\r");
  }
  else {
    printf("pal_fan_set_speed return failed. Expected:PAL_OK Actual:%u\r\n\r\n",(ulong)pVar1);
  }
  return (uint)(pVar1 != PAL_OK);
}

Assistant:

int pal_fan_set_speed_low_success(void) {
    printf("Execute test pal_fan_set_speed_low_success\r\n");
    ///arrange
    int speed_rpm = -800;

    ///act
    pal_result result = pal_fan_set_speed(speed_rpm);

    ///assert
    if (result != PAL_OK) {
        printf("pal_fan_set_speed return failed. Expected:PAL_OK Actual:%u\r\n\r\n", result);
        return 1;
    }
    printf("Succeeded\r\n\r\n");
    return 0;
}